

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

string * __thiscall
pbrt::syntactic::PixelFilter::toString_abi_cxx11_(string *__return_storage_ptr__,PixelFilter *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"PixelFilter<",&(this->super_Node).type);
  std::operator+(__return_storage_ptr__,&local_30,">");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const override { return "PixelFilter<"+type+">"; }